

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadMessage.cpp
# Opt level: O2

string * __thiscall
ReadMessage::execute_abi_cxx11_(string *__return_storage_ptr__,ReadMessage *this)

{
  char cVar1;
  bool bVar2;
  DIR *__dirp;
  dirent *pdVar3;
  int iVar4;
  string result;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream messageFile;
  byte abStack_218 [488];
  
  std::__cxx11::string::string((string *)&result,"",(allocator *)&messageFile);
  std::__cxx11::string::string
            ((string *)&line,(this->super_ServerOperation).MESSAGEDIR,(allocator *)&local_298);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageFile,
                 &line,"/");
  std::operator+(&dir,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &messageFile,&this->User);
  std::__cxx11::string::~string((string *)&messageFile);
  std::__cxx11::string::~string((string *)&line);
  __dirp = opendir(dir._M_dataplus._M_p);
  std::ifstream::ifstream(&messageFile);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  if (__dirp == (DIR *)0x0) {
    std::__cxx11::string::assign((char *)&(this->super_ServerOperation).statusMessage);
    closedir((DIR *)0x0);
    std::operator+(&local_298,"No such User \"",&this->User);
    std::operator+(__return_storage_ptr__,&local_298,"\" found\n");
    std::__cxx11::string::~string((string *)&local_298);
  }
  else {
    iVar4 = 0;
    while( true ) {
      pdVar3 = readdir(__dirp);
      if ((pdVar3 == (dirent *)0x0) || (this->MessageNumber < iVar4)) break;
      if (pdVar3->d_type == '\b') {
        std::operator+(&local_258,&dir,"/");
        std::operator+(&local_298,&local_258,pdVar3->d_name);
        std::ifstream::open((string *)&messageFile,(_Ios_Openmode)&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_258);
        cVar1 = std::__basic_file<char>::is_open();
        if (cVar1 != '\0') {
          iVar4 = iVar4 + 1;
          if (iVar4 == this->MessageNumber) {
            while ((abStack_218[*(long *)(_messageFile + -0x18)] & 2) == 0) {
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&messageFile,(string *)&line);
              std::__cxx11::string::append((string *)&result);
              std::__cxx11::string::append((char *)&result);
            }
          }
          std::ifstream::close();
        }
      }
    }
    bVar2 = std::operator==(&result,"");
    if (bVar2) {
      std::__cxx11::string::assign((char *)&(this->super_ServerOperation).statusMessage);
      std::__cxx11::string::assign((char *)&result);
    }
    std::__cxx11::string::assign((char *)&(this->super_ServerOperation).statusMessage);
    closedir(__dirp);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p == &result.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(result.field_2._M_allocated_capacity._1_7_,result.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = result.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = result._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(result.field_2._M_allocated_capacity._1_7_,result.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = result._M_string_length;
    result._M_string_length = 0;
    result.field_2._M_local_buf[0] = '\0';
    result._M_dataplus._M_p = (pointer)&result.field_2;
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&messageFile);
  std::__cxx11::string::~string((string *)&dir);
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

string ReadMessage::execute() {
    string result = "";
    int count = 0;
    string dir = string(MESSAGEDIR) + "/" + User;

    DIR* userDir = opendir(dir.c_str()); //Open User Directory

    struct dirent * userDirEntry; //individual entries in the directory.
    ifstream messageFile;
    string line;

    //if no directory found return 0
    if(userDir == nullptr){
        statusMessage = FAILURE;
        closedir(userDir);
        return "No such User \"" + User + "\" found\n";
    }

    //while directory isn't empty or didn't reach right file keep looking:
    while((userDirEntry = readdir(userDir)) != nullptr && count <= MessageNumber){
        //only read regular files
        if(userDirEntry->d_type == DT_REG){
            //ToDo: look if filename ends with .msg or .txt
            messageFile.open(dir + "/" + userDirEntry->d_name);
            if(messageFile.is_open()){
                //count as countable file
                count ++;
                if(count == MessageNumber){
                    //reading if reached right file
                    while(!messageFile.eof()){
                        //read till the end and save lines to the result:
                        getline(messageFile, line);
                        result.append(line);
                        result.append("\n");
                    }
                }
                //close file again
                messageFile.close();
            }
        }
    }

    if(result == ""){
        statusMessage = FAILURE;
        result = "No matching file found.\n";
    }

    statusMessage = SUCCESS;
    closedir(userDir);
    return result;
}